

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name_unittest.cc
# Opt level: O0

void __thiscall
bssl::ParseNameTest_RFC2253FormatMultiRDN_Test::TestBody
          (ParseNameTest_RFC2253FormatMultiRDN_Test *this)

{
  Input name_tlv;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_188;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  string output;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0 [3];
  uchar *local_b8;
  uchar *puStack_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  RDNSequence rdn;
  undefined1 auStack_68 [8];
  Input rdn_input;
  uint8_t der [70];
  ParseNameTest_RFC2253FormatMultiRDN_Test *this_local;
  
  rdn_input.data_.size_ = 0x30609300b314430;
  Span<unsigned_char_const>::Span<70ul>
            ((Span<unsigned_char_const> *)
             &rdn.
              super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (uchar (*) [70])&rdn_input.data_.size_);
  bssl::der::Input::Input((Input *)auStack_68,stack0xffffffffffffff88);
  ::std::
  vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ::vector((vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
            *)&gtest_ar_.message_);
  local_b8 = (uchar *)auStack_68;
  puStack_b0 = rdn_input.data_.data_;
  name_tlv.data_.size_ = (size_t)rdn_input.data_.data_;
  name_tlv.data_.data_ = (uchar *)auStack_68;
  local_a1 = ParseName(name_tlv,(RDNSequence *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_a0,(AssertionResult *)"ParseName(rdn_input, &rdn)",
               "false","true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0x11e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&gtest_ar__1.message_);
    local_131 = ConvertToRFC2253((RDNSequence *)&gtest_ar_.message_,(string *)&gtest_ar__1.message_)
    ;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_130,&local_131,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_130,
                 (AssertionResult *)"ConvertToRFC2253(rdn, &output)","false","true",in_R9);
      pcVar2 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                 ,0x120,pcVar2);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_140);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    if (bVar1) {
      testing::internal::EqHelper::
      Compare<char[40],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_178,"\"OU=Sales+CN=J. Smith,O=Widget Inc.,C=US\"","output",
                 (char (*) [40])"OU=Sales+CN=J. Smith,O=Widget Inc.,C=US",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &gtest_ar__1.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                   ,0x121,pcVar2);
        testing::internal::AssertHelper::operator=(&local_188,&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        testing::Message::~Message(&local_180);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
    }
    ::std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
  }
  ::std::
  vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ::~vector((vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
             *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ParseNameTest, RFC2253FormatMultiRDN) {
  const uint8_t der[] = {
      0x30, 0x44, 0x31, 0x0b, 0x30, 0x09, 0x06, 0x03, 0x55, 0x04, 0x06, 0x13,
      0x02, 0x55, 0x53, 0x31, 0x14, 0x30, 0x12, 0x06, 0x03, 0x55, 0x04, 0x0a,
      0x13, 0x0b, 0x57, 0x69, 0x64, 0x67, 0x65, 0x74, 0x20, 0x49, 0x6e, 0x63,
      0x2e, 0x31, 0x1f, 0x30, 0x0c, 0x06, 0x03, 0x55, 0x04, 0x0b, 0x13, 0x05,
      0x53, 0x61, 0x6c, 0x65, 0x73, 0x30, 0x0f, 0x06, 0x03, 0x55, 0x04, 0x03,
      0x13, 0x08, 0x4a, 0x2e, 0x20, 0x53, 0x6d, 0x69, 0x74, 0x68};
  der::Input rdn_input(der);
  RDNSequence rdn;
  ASSERT_TRUE(ParseName(rdn_input, &rdn));
  std::string output;
  ASSERT_TRUE(ConvertToRFC2253(rdn, &output));
  ASSERT_EQ("OU=Sales+CN=J. Smith,O=Widget Inc.,C=US", output);
}